

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O3

void __thiscall RenX_ServerListPlugin::~RenX_ServerListPlugin(RenX_ServerListPlugin *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 in_R9;
  undefined4 local_40;
  undefined4 uStack_38;
  undefined4 local_30;
  undefined4 uStack_28;
  undefined4 local_20;
  undefined4 uStack_18;
  
  *(undefined ***)this = &PTR_think_001147b0;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_00114c90;
  uVar3 = getHTTPServer();
  local_20 = (undefined4)(this->m_server_list_page_name)._M_string_length;
  uStack_18 = SUB84((this->m_server_list_page_name)._M_dataplus._M_p,0);
  Jupiter::HTTP::Server::remove
            (uVar3,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p,in_R9,local_20,
             uStack_18);
  local_30 = (undefined4)(this->m_server_list_long_page_name)._M_string_length;
  uStack_28 = SUB84((this->m_server_list_long_page_name)._M_dataplus._M_p,0);
  Jupiter::HTTP::Server::remove
            (uVar3,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p,in_R9,local_30,
             uStack_28);
  local_40 = (undefined4)(this->m_server_page_name)._M_string_length;
  uStack_38 = SUB84((this->m_server_page_name)._M_dataplus._M_p,0);
  Jupiter::HTTP::Server::remove
            (uVar3,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p,in_R9,local_40,
             uStack_38);
  pcVar2 = (this->m_metadata_prometheus_page_name)._M_dataplus._M_p;
  paVar1 = &(this->m_metadata_prometheus_page_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_metadata_page_name)._M_dataplus._M_p;
  paVar1 = &(this->m_metadata_page_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_server_page_name)._M_dataplus._M_p;
  paVar1 = &(this->m_server_page_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_server_list_long_page_name)._M_dataplus._M_p;
  paVar1 = &(this->m_server_list_long_page_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_server_list_page_name)._M_dataplus._M_p;
  paVar1 = &(this->m_server_list_page_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_web_path)._M_dataplus._M_p;
  paVar1 = &(this->m_web_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_web_hostname)._M_dataplus._M_p;
  paVar1 = &(this->m_web_hostname).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_metadata_prometheus)._M_dataplus._M_p;
  paVar1 = &(this->m_metadata_prometheus).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_metadata_json)._M_dataplus._M_p;
  paVar1 = &(this->m_metadata_json).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_server_list_json)._M_dataplus._M_p;
  paVar1 = &(this->m_server_list_json).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  RenX::Plugin::~Plugin(&this->super_Plugin);
  return;
}

Assistant:

RenX_ServerListPlugin::~RenX_ServerListPlugin() {
	Jupiter::HTTP::Server &server = getHTTPServer();
	server.remove(m_web_hostname, m_web_path, m_server_list_page_name);
	server.remove(m_web_hostname, m_web_path, m_server_list_long_page_name);
	server.remove(m_web_hostname, m_web_path, m_server_page_name);
}